

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void __thiscall AActor::SetTranslation(AActor *this,FName *trname)

{
  DWORD DVar1;
  char *pcVar2;
  AActor *pAVar3;
  FName local_20 [2];
  FName *pFStack_18;
  int tnum;
  FName *trname_local;
  AActor *this_local;
  
  pFStack_18 = trname;
  trname_local = (FName *)this;
  pcVar2 = FName::GetChars(trname);
  if (*pcVar2 == '\0') {
    pAVar3 = GetDefault(this);
    this->Translation = pAVar3->Translation;
  }
  else {
    FName::FName(local_20,trname);
    DVar1 = R_FindCustomTranslation(local_20);
    if (-1 < (int)DVar1) {
      this->Translation = DVar1;
    }
  }
  return;
}

Assistant:

void AActor::SetTranslation(FName trname)
{
	// There is no constant for the empty name...
	if (trname.GetChars()[0] == 0)
	{
		// an empty string resets to the default
		Translation = GetDefault()->Translation;
		return;
	}

	int tnum = R_FindCustomTranslation(trname);
	if (tnum >= 0)
	{
		Translation = tnum;
	}
	// silently ignore if the name does not exist, this would create some insane message spam otherwise.
}